

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall args::Base::~Base(Base *this)

{
  pointer pcVar1;
  
  this->_vptr_Base = (_func_int **)&PTR__Base_001338e0;
  pcVar1 = (this->help)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->help).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

virtual ~Base() {}